

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall TokenField::saveXml(TokenField *this,ostream *s)

{
  ostream *poVar1;
  void *this_00;
  ostream *s_local;
  TokenField *this_local;
  
  std::operator<<(s,"<tokenfield");
  std::operator<<(s," bigendian=\"");
  if ((this->bigendian & 1U) == 0) {
    std::operator<<(s,"false\"");
  }
  else {
    std::operator<<(s,"true\"");
  }
  std::operator<<(s," signbit=\"");
  if ((this->signbit & 1U) == 0) {
    std::operator<<(s,"false\"");
  }
  else {
    std::operator<<(s,"true\"");
  }
  poVar1 = std::operator<<(s," bitstart=\"");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this_00,this->bitstart);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," bitend=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bitend);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," bytestart=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bytestart);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," byteend=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->byteend);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," shift=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->shift);
  std::operator<<(poVar1,"\"/>\n");
  return;
}

Assistant:

void TokenField::saveXml(ostream &s) const

{
  s << "<tokenfield";
  s << " bigendian=\"";
  if (bigendian)
    s << "true\"";
  else
    s << "false\"";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " bitstart=\"" << dec << bitstart << "\"";
  s << " bitend=\"" << bitend << "\"";
  s << " bytestart=\"" << bytestart << "\"";
  s << " byteend=\"" << byteend << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}